

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_checker.cc
# Opt level: O1

bool __thiscall dd::SequenceCheckerImpl::IsCurrent(SequenceCheckerImpl *this)

{
  undefined1 extraout_AL;
  TaskQueueBase *pTVar1;
  PlatformThreadRef PVar2;
  undefined1 uVar3;
  PlatformThreadRef current_thread;
  
  pTVar1 = TaskQueueBase::Current();
  PVar2 = CurrentThreadRef();
  pthread_mutex_lock((pthread_mutex_t *)this);
  if (this->_attached == false) {
    this->_attached = true;
    this->_valid_thread = PVar2;
    this->_valid_queue = pTVar1;
    this->_valid_system_queue = (void *)0x0;
    uVar3 = 1;
  }
  else if (pTVar1 == (TaskQueueBase *)0x0 && this->_valid_queue == (TaskQueueBase *)0x0) {
    IsThreadRefEqual((char *)&this->_valid_thread);
    uVar3 = extraout_AL;
  }
  else {
    uVar3 = this->_valid_queue == pTVar1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return (bool)uVar3;
}

Assistant:

bool SequenceCheckerImpl::IsCurrent() const
	{
		const TaskQueueBase* const current_queue = TaskQueueBase::Current();
		const PlatformThreadRef current_thread = CurrentThreadRef();
		const void* const current_system_queue = GetSystemQueueRef();
		AutoLock lock(_lock);
		if (!_attached)
		{
			_attached = true;
			_valid_thread = current_thread;
			_valid_queue = current_queue;
			_valid_system_queue = current_system_queue;
			return true;
		}
		if (_valid_queue || current_queue)
			return _valid_queue == current_queue;
		if (_valid_system_queue && _valid_system_queue == current_system_queue)
			return true;
		return IsThreadRefEqual(_valid_thread, current_thread);
	}